

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

SUNErrCode
SUNLinSolSetPreconditioner_SPGMR
          (SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  void *pvVar1;
  
  pvVar1 = S->content;
  *(SUNPSetupFn *)((long)pvVar1 + 0x38) = Psetup;
  *(SUNPSolveFn *)((long)pvVar1 + 0x40) = Psolve;
  *(void **)((long)pvVar1 + 0x48) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_SPGMR(SUNLinearSolver S, void* PData,
                                            SUNPSetupFn Psetup,
                                            SUNPSolveFn Psolve)
{
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  SPGMR_CONTENT(S)->Psetup = Psetup;
  SPGMR_CONTENT(S)->Psolve = Psolve;
  SPGMR_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}